

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

FileChecksum *
llbuild::basic::FileChecksum::getChecksumForPath(FileChecksum *__return_storage_ptr__,string *path)

{
  bool bVar1;
  FileInfo fileInfo;
  PlatformSpecificHasher hasher;
  FileInfo FStack_128;
  FileChecksumHasherMD5 local_d8;
  
  __return_storage_ptr__->bytes[0x10] = '\0';
  __return_storage_ptr__->bytes[0x11] = '\0';
  __return_storage_ptr__->bytes[0x12] = '\0';
  __return_storage_ptr__->bytes[0x13] = '\0';
  __return_storage_ptr__->bytes[0x14] = '\0';
  __return_storage_ptr__->bytes[0x15] = '\0';
  __return_storage_ptr__->bytes[0x16] = '\0';
  __return_storage_ptr__->bytes[0x17] = '\0';
  __return_storage_ptr__->bytes[0x18] = '\0';
  __return_storage_ptr__->bytes[0x19] = '\0';
  __return_storage_ptr__->bytes[0x1a] = '\0';
  __return_storage_ptr__->bytes[0x1b] = '\0';
  __return_storage_ptr__->bytes[0x1c] = '\0';
  __return_storage_ptr__->bytes[0x1d] = '\0';
  __return_storage_ptr__->bytes[0x1e] = '\0';
  __return_storage_ptr__->bytes[0x1f] = '\0';
  __return_storage_ptr__->bytes[0] = '\0';
  __return_storage_ptr__->bytes[1] = '\0';
  __return_storage_ptr__->bytes[2] = '\0';
  __return_storage_ptr__->bytes[3] = '\0';
  __return_storage_ptr__->bytes[4] = '\0';
  __return_storage_ptr__->bytes[5] = '\0';
  __return_storage_ptr__->bytes[6] = '\0';
  __return_storage_ptr__->bytes[7] = '\0';
  __return_storage_ptr__->bytes[8] = '\0';
  __return_storage_ptr__->bytes[9] = '\0';
  __return_storage_ptr__->bytes[10] = '\0';
  __return_storage_ptr__->bytes[0xb] = '\0';
  __return_storage_ptr__->bytes[0xc] = '\0';
  __return_storage_ptr__->bytes[0xd] = '\0';
  __return_storage_ptr__->bytes[0xe] = '\0';
  __return_storage_ptr__->bytes[0xf] = '\0';
  FileInfo::getInfoForPath(&FStack_128,path,false);
  bVar1 = FileInfo::isMissing(&FStack_128);
  if (!bVar1) {
    if ((FStack_128.mode._1_1_ & 0x40) != 0) {
      __return_storage_ptr__->bytes[0] = '\x01';
      return __return_storage_ptr__;
    }
    FileChecksumHasherMD5::FileChecksumHasherMD5(&local_d8,path);
    bVar1 = FileChecksumHasher::readAndDigest(&local_d8.super_FileChecksumHasher);
    if (bVar1) goto LAB_001b2b78;
  }
  local_d8.output.Bytes._M_elems[0] = '\0';
  local_d8.output.Bytes._M_elems[1] = '\0';
  local_d8.output.Bytes._M_elems[2] = '\0';
  local_d8.output.Bytes._M_elems[3] = '\0';
  local_d8.output.Bytes._M_elems[4] = '\0';
  local_d8.output.Bytes._M_elems[5] = '\0';
  local_d8.output.Bytes._M_elems[6] = '\0';
  local_d8.output.Bytes._M_elems[7] = '\0';
  local_d8.output.Bytes._M_elems[8] = '\0';
  local_d8.output.Bytes._M_elems[9] = '\0';
  local_d8.output.Bytes._M_elems[10] = '\0';
  local_d8.output.Bytes._M_elems[0xb] = '\0';
  local_d8.output.Bytes._M_elems[0xc] = '\0';
  local_d8.output.Bytes._M_elems[0xd] = '\0';
  local_d8.output.Bytes._M_elems[0xe] = '\0';
  local_d8.output.Bytes._M_elems[0xf] = '\0';
  __return_storage_ptr__->bytes[0x10] = '\0';
  __return_storage_ptr__->bytes[0x11] = '\0';
  __return_storage_ptr__->bytes[0x12] = '\0';
  __return_storage_ptr__->bytes[0x13] = '\0';
  __return_storage_ptr__->bytes[0x14] = '\0';
  __return_storage_ptr__->bytes[0x15] = '\0';
  __return_storage_ptr__->bytes[0x16] = '\0';
  __return_storage_ptr__->bytes[0x17] = '\0';
  __return_storage_ptr__->bytes[0x18] = '\0';
  __return_storage_ptr__->bytes[0x19] = '\0';
  __return_storage_ptr__->bytes[0x1a] = '\0';
  __return_storage_ptr__->bytes[0x1b] = '\0';
  __return_storage_ptr__->bytes[0x1c] = '\0';
  __return_storage_ptr__->bytes[0x1d] = '\0';
  __return_storage_ptr__->bytes[0x1e] = '\0';
  __return_storage_ptr__->bytes[0x1f] = '\0';
LAB_001b2b78:
  *(undefined4 *)__return_storage_ptr__->bytes = local_d8.output.Bytes._M_elems._0_4_;
  *(undefined4 *)(__return_storage_ptr__->bytes + 4) = local_d8.output.Bytes._M_elems._4_4_;
  *(undefined4 *)(__return_storage_ptr__->bytes + 8) = local_d8.output.Bytes._M_elems._8_4_;
  *(undefined4 *)(__return_storage_ptr__->bytes + 0xc) = local_d8.output.Bytes._M_elems._12_4_;
  return __return_storage_ptr__;
}

Assistant:

FileChecksum FileChecksum::getChecksumForPath(const std::string& path) {
  FileChecksum result;

  FileInfo fileInfo = FileInfo::getInfoForPath(path);
  if (fileInfo.isMissing()) {
    memset(result.bytes, 0, sizeof(result.bytes));
  } else if (fileInfo.isDirectory()) {
    result.bytes[0] = 1;
  } else {
    PlatformSpecificHasher hasher(path);
    if (hasher.readAndDigest()) {
      hasher.copy(result.bytes);
    } else {
      memset(result.bytes, 0, sizeof(result.bytes));
    }
  }

  return result;
}